

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ReconstructLineOffsets
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,size_t n,uchar *head,
               uchar *marker,size_t size)

{
  value_type vVar1;
  reference pvVar2;
  int *in_RCX;
  long in_RDX;
  ulong in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  ulong in_R8;
  uint data_len;
  int y;
  size_t offset;
  size_t i;
  uint local_48;
  int local_44;
  value_type local_40;
  ulong local_38;
  ulong local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_38 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_18 <= local_38) {
      return true;
    }
    local_40 = (long)local_28 - local_20;
    if (local_30 <= local_40 + 8) break;
    local_44 = *local_28;
    local_48 = local_28[1];
    if (local_30 <= local_48) {
      return false;
    }
    swap4(&local_44);
    swap4(&local_48);
    vVar1 = local_40;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,local_38);
    *pvVar2 = vVar1;
    local_28 = (int *)((long)local_28 + (ulong)(local_48 + 8));
    local_38 = local_38 + 1;
  }
  return false;
}

Assistant:

static bool ReconstructLineOffsets(
    std::vector<tinyexr::tinyexr_uint64> *offsets, size_t n,
    const unsigned char *head, const unsigned char *marker, const size_t size) {
  assert(head < marker);
  assert(offsets->size() == n);

  for (size_t i = 0; i < n; i++) {
    size_t offset = static_cast<size_t>(marker - head);
    // Offset should not exceed whole EXR file/data size.
    if ((offset + sizeof(tinyexr::tinyexr_uint64)) >= size) {
      return false;
    }

    int y;
    unsigned int data_len;

    memcpy(&y, marker, sizeof(int));
    memcpy(&data_len, marker + 4, sizeof(unsigned int));

    if (data_len >= size) {
      return false;
    }

    tinyexr::swap4(&y);
    tinyexr::swap4(&data_len);

    (*offsets)[i] = offset;

    marker += data_len + 8;  // 8 = 4 bytes(y) + 4 bytes(data_len)
  }

  return true;
}